

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O1

int arkStep_NlsInit(ARKodeMem ark_mem)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  int error_code;
  code *pcVar4;
  char *pcVar5;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    pcVar5 = "Time step module memory is NULL.";
    iVar3 = -0x15;
    error_code = -0x15;
    iVar2 = 0x123;
LAB_00122846:
    arkProcessError(ark_mem,error_code,iVar2,"arkStep_NlsInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_nls.c"
                    ,pcVar5);
  }
  else {
    *(undefined8 *)((long)pvVar1 + 0x1a0) = 0;
    *(undefined8 *)((long)pvVar1 + 0x1a8) = 0;
    if (*(long *)((long)pvVar1 + 0x128) == 0) {
      pcVar4 = (code *)0x0;
    }
    else {
      pcVar4 = arkStep_NlsLSetup;
    }
    iVar2 = SUNNonlinSolSetLSetupFn(*(undefined8 *)((long)pvVar1 + 0x88),pcVar4);
    if (iVar2 == 0) {
      if (*(long *)((long)pvVar1 + 0x130) == 0) {
        pcVar4 = (code *)0x0;
      }
      else {
        pcVar4 = arkStep_NlsLSolve;
      }
      iVar2 = SUNNonlinSolSetLSolveFn(*(undefined8 *)((long)pvVar1 + 0x88),pcVar4);
      if (iVar2 == 0) {
        iVar2 = arkStep_SetNlsSysFn(ark_mem);
        if (iVar2 != 0) {
          pcVar5 = "Setting nonlinear system function failed";
          iVar3 = -0x16;
          error_code = -0x16;
          iVar2 = 0x14a;
          goto LAB_00122846;
        }
        iVar2 = SUNNonlinSolInitialize(*(undefined8 *)((long)pvVar1 + 0x88));
        if (iVar2 == 0) {
          return 0;
        }
        pcVar5 = "The nonlinear solver\'s init routine failed.";
        iVar2 = 0x153;
      }
      else {
        pcVar5 = "Setting linear solver solve function failed";
        iVar2 = 0x142;
      }
    }
    else {
      pcVar5 = "Setting the linear solver setup function failed";
      iVar2 = 0x135;
    }
    arkProcessError(ark_mem,-0x16,iVar2,"arkStep_NlsInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_nls.c"
                    ,pcVar5);
    iVar3 = -0x1d;
  }
  return iVar3;
}

Assistant:

int arkStep_NlsInit(ARKodeMem ark_mem)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* reset counters */
  step_mem->nls_iters = 0;
  step_mem->nls_fails = 0;

  /* set the linear solver setup wrapper function */
  if (step_mem->lsetup)
  {
    retval = SUNNonlinSolSetLSetupFn(step_mem->NLS, arkStep_NlsLSetup);
  }
  else { retval = SUNNonlinSolSetLSetupFn(step_mem->NLS, NULL); }
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting the linear solver setup function failed");
    return (ARK_NLS_INIT_FAIL);
  }

  /* set the linear solver solve wrapper function */
  if (step_mem->lsolve)
  {
    retval = SUNNonlinSolSetLSolveFn(step_mem->NLS, arkStep_NlsLSolve);
  }
  else { retval = SUNNonlinSolSetLSolveFn(step_mem->NLS, NULL); }
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting linear solver solve function failed");
    return (ARK_NLS_INIT_FAIL);
  }

  retval = arkStep_SetNlsSysFn(ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Setting nonlinear system function failed");
    return (ARK_ILL_INPUT);
  }

  /* initialize nonlinear solver */
  retval = SUNNonlinSolInitialize(step_mem->NLS);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NLS_INIT_FAIL);
    return (ARK_NLS_INIT_FAIL);
  }

  return (ARK_SUCCESS);
}